

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_points.h
# Opt level: O2

PrimInfo * __thiscall
embree::avx::PointsISA::createPrimRefArrayMB
          (PrimInfo *__return_storage_ptr__,PointsISA *this,PrimRef *prims,BBox1f *time_range,
          range<unsigned_long> *r,size_t k,uint geomID)

{
  RawBufferView *pRVar1;
  float fVar2;
  BBox1f BVar3;
  BufferView<embree::Vec3fx> *pBVar4;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar5;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar6;
  float fVar7;
  int iVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  int iVar11;
  ulong uVar12;
  int iVar13;
  size_t *psVar14;
  undefined4 uVar15;
  long lVar16;
  int iVar17;
  size_t itime;
  uint index;
  unsigned_long uVar18;
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 extraout_var [56];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  float fVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [16];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  float fVar35;
  undefined1 auVar34 [16];
  float fVar36;
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  ulong local_1b0;
  undefined1 local_1a8 [8];
  float fStack_1a0;
  float fStack_19c;
  anon_class_16_2_4e716a3c local_198;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  undefined1 local_168 [8];
  float fStack_160;
  float fStack_15c;
  range<unsigned_long> *local_158;
  size_t local_150;
  size_t local_148;
  PrimRef *local_140;
  BBox<embree::Vec3fa> bupper1;
  BBox<embree::Vec3fa> blower0;
  BBox<embree::Vec3fa> bi;
  BBox<embree::Vec3fa> bupper0;
  BBox<embree::Vec3fa> blower1;
  
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[0] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[1] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[2] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[3] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[0] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[1] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[2] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[3] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[0] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[1] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[2] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[3] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[0] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[1] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[2] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[3] = -INFINITY;
  __return_storage_ptr__->begin = SUB168(ZEXT816(0) << 0x20,0);
  __return_storage_ptr__->end = SUB168(ZEXT816(0) << 0x20,8);
  auVar32._0_8_ = Geometry::getTimeRange((Geometry *)this);
  auVar32._8_56_ = extraout_var;
  auVar23._8_8_ = 0;
  auVar23._0_4_ = time_range->lower;
  auVar23._4_4_ = time_range->upper;
  auVar20 = auVar32._0_16_;
  auVar24 = vcmpps_avx(auVar20,auVar23,1);
  auVar21 = vblendps_avx(auVar23,auVar20,2);
  auVar20 = vinsertps_avx(auVar20,auVar23,0x50);
  auVar21 = vblendvps_avx(auVar20,auVar21,auVar24);
  auVar32 = ZEXT1664(auVar21);
  auVar24 = vmovshdup_avx(auVar21);
  auVar33 = ZEXT1664(auVar24);
  if (auVar21._0_4_ <= auVar24._0_4_) {
    uVar18 = r->_begin;
    local_150 = 0;
    auVar37 = ZEXT1664(ZEXT816(0) << 0x40);
    auVar38 = ZEXT1664(CONCAT412(0xddccb9a2,CONCAT48(0xddccb9a2,0xddccb9a2ddccb9a2)));
    auVar39 = ZEXT1664(CONCAT412(0x5dccb9a2,CONCAT48(0x5dccb9a2,0x5dccb9a25dccb9a2)));
    auVar24._8_4_ = 0xff800000;
    auVar24._0_8_ = 0xff800000ff800000;
    auVar24._12_4_ = 0xff800000;
    auVar30 = ZEXT1664(auVar24);
    auVar40 = ZEXT1664(auVar24);
    auVar21._8_4_ = 0x7f800000;
    auVar21._0_8_ = 0x7f8000007f800000;
    auVar21._12_4_ = 0x7f800000;
    auVar29 = ZEXT1664(auVar21);
    auVar41 = ZEXT1664(auVar21);
    local_158 = r;
    local_140 = prims;
    while( true ) {
      local_198.primID = &local_1b0;
      if (local_158->_end <= uVar18) break;
      BVar3 = (this->super_Points).super_Geometry.time_range;
      auVar20._8_8_ = 0;
      auVar20._0_4_ = BVar3.lower;
      auVar20._4_4_ = BVar3.upper;
      auVar21 = vmovshdup_avx(auVar20);
      fVar19 = BVar3.lower;
      fVar7 = auVar21._0_4_ - fVar19;
      pBVar4 = (this->super_Points).vertices.items;
      if ((uVar18 & 0xffffffff) < (pBVar4->super_RawBufferView).num) {
        fVar2 = (this->super_Points).super_Geometry.fnumTimeSegments;
        auVar24 = ZEXT416((uint)(fVar2 * ((auVar33._0_4_ - fVar19) / fVar7) * 0.99999976));
        auVar24 = vroundss_avx(auVar24,auVar24,10);
        auVar20 = vminss_avx(auVar24,ZEXT416((uint)fVar2));
        fVar27 = auVar32._0_4_ - fVar19;
        auVar24 = ZEXT416((uint)(fVar2 * (fVar27 / fVar7) * 1.0000002));
        auVar24 = vroundss_avx(auVar24,auVar24,9);
        auVar24 = vmaxss_avx(auVar37._0_16_,auVar24);
        psVar14 = &pBVar4[(int)auVar24._0_4_].super_RawBufferView.stride;
        uVar12 = (long)(int)auVar24._0_4_ - 1;
LAB_00bf4f7a:
        uVar12 = uVar12 + 1;
        if ((ulong)(long)(int)auVar20._0_4_ < uVar12) {
          local_178 = auVar21._0_4_ - fVar19;
          fVar27 = fVar27 / local_178;
          local_178 = (auVar33._0_4_ - fVar19) / local_178;
          fVar7 = fVar2 * fVar27;
          fVar19 = fVar2 * local_178;
          auVar20 = vroundss_avx(ZEXT416((uint)fVar7),ZEXT416((uint)fVar7),9);
          auVar23 = vroundss_avx(ZEXT416((uint)fVar19),ZEXT416((uint)fVar19),10);
          auVar21 = vmaxss_avx(auVar20,auVar37._0_16_);
          local_168._0_4_ = auVar21._0_4_;
          auVar24 = vminss_avx(auVar23,ZEXT416((uint)fVar2));
          iVar11 = (int)auVar21._0_4_;
          local_1a8._0_4_ = auVar24._0_4_;
          iVar13 = (int)auVar24._0_4_;
          local_188 = (float)(int)auVar20._0_4_;
          iVar17 = -1;
          if (-1 < (int)local_188) {
            iVar17 = (int)local_188;
          }
          iVar8 = (int)fVar2 + 1;
          if ((int)auVar23._0_4_ < (int)fVar2 + 1) {
            iVar8 = (int)auVar23._0_4_;
          }
          local_1b0 = uVar18;
          local_198.this = &this->super_Points;
          local_148 = k;
          Points::linearBounds::anon_class_16_2_4e716a3c::operator()
                    (&blower0,&local_198,(long)iVar11);
          Points::linearBounds::anon_class_16_2_4e716a3c::operator()
                    (&bupper1,&local_198,(long)iVar13);
          fVar7 = fVar7 - (float)local_168._0_4_;
          if (iVar8 - iVar17 == 1) {
            auVar21 = vmaxss_avx(ZEXT416((uint)fVar7),ZEXT816(0) << 0x40);
            auVar24 = vshufps_avx(auVar21,auVar21,0);
            auVar21 = ZEXT416((uint)(1.0 - auVar21._0_4_));
            auVar21 = vshufps_avx(auVar21,auVar21,0);
            auVar31._0_4_ =
                 auVar24._0_4_ * bupper1.lower.field_0.m128[0] +
                 auVar21._0_4_ * blower0.lower.field_0.m128[0];
            auVar31._4_4_ =
                 auVar24._4_4_ * bupper1.lower.field_0.m128[1] +
                 auVar21._4_4_ * blower0.lower.field_0.m128[1];
            auVar31._8_4_ =
                 auVar24._8_4_ * bupper1.lower.field_0.m128[2] +
                 auVar21._8_4_ * blower0.lower.field_0.m128[2];
            auVar31._12_4_ =
                 auVar24._12_4_ * bupper1.lower.field_0.m128[3] +
                 auVar21._12_4_ * blower0.lower.field_0.m128[3];
            auVar34._0_4_ =
                 auVar24._0_4_ * bupper1.upper.field_0.m128[0] +
                 auVar21._0_4_ * blower0.upper.field_0.m128[0];
            auVar34._4_4_ =
                 auVar24._4_4_ * bupper1.upper.field_0.m128[1] +
                 auVar21._4_4_ * blower0.upper.field_0.m128[1];
            auVar34._8_4_ =
                 auVar24._8_4_ * bupper1.upper.field_0.m128[2] +
                 auVar21._8_4_ * blower0.upper.field_0.m128[2];
            auVar34._12_4_ =
                 auVar24._12_4_ * bupper1.upper.field_0.m128[3] +
                 auVar21._12_4_ * blower0.upper.field_0.m128[3];
            auVar21 = vmaxss_avx(ZEXT416((uint)((float)local_1a8._0_4_ - fVar19)),ZEXT816(0) << 0x40
                                );
            auVar24 = vshufps_avx(auVar21,auVar21,0);
            auVar21 = ZEXT416((uint)(1.0 - auVar21._0_4_));
            auVar21 = vshufps_avx(auVar21,auVar21,0);
            auVar25._0_4_ =
                 auVar21._0_4_ * bupper1.lower.field_0.m128[0] +
                 auVar24._0_4_ * blower0.lower.field_0.m128[0];
            auVar25._4_4_ =
                 auVar21._4_4_ * bupper1.lower.field_0.m128[1] +
                 auVar24._4_4_ * blower0.lower.field_0.m128[1];
            auVar25._8_4_ =
                 auVar21._8_4_ * bupper1.lower.field_0.m128[2] +
                 auVar24._8_4_ * blower0.lower.field_0.m128[2];
            auVar25._12_4_ =
                 auVar21._12_4_ * bupper1.lower.field_0.m128[3] +
                 auVar24._12_4_ * blower0.lower.field_0.m128[3];
            auVar28._0_4_ =
                 auVar21._0_4_ * bupper1.upper.field_0.m128[0] +
                 auVar24._0_4_ * blower0.upper.field_0.m128[0];
            auVar28._4_4_ =
                 auVar21._4_4_ * bupper1.upper.field_0.m128[1] +
                 auVar24._4_4_ * blower0.upper.field_0.m128[1];
            auVar28._8_4_ =
                 auVar21._8_4_ * bupper1.upper.field_0.m128[2] +
                 auVar24._8_4_ * blower0.upper.field_0.m128[2];
            auVar28._12_4_ =
                 auVar21._12_4_ * bupper1.upper.field_0.m128[3] +
                 auVar24._12_4_ * blower0.upper.field_0.m128[3];
          }
          else {
            Points::linearBounds::anon_class_16_2_4e716a3c::operator()
                      (&blower1,&local_198,(long)(iVar11 + 1));
            Points::linearBounds::anon_class_16_2_4e716a3c::operator()
                      (&bupper0,&local_198,(long)(iVar13 + -1));
            auVar21 = vmaxss_avx(ZEXT416((uint)fVar7),ZEXT816(0) << 0x40);
            auVar24 = vshufps_avx(auVar21,auVar21,0);
            auVar21 = ZEXT416((uint)(1.0 - auVar21._0_4_));
            auVar21 = vshufps_avx(auVar21,auVar21,0);
            auVar31._0_4_ =
                 auVar24._0_4_ * blower1.lower.field_0.m128[0] +
                 auVar21._0_4_ * blower0.lower.field_0.m128[0];
            auVar31._4_4_ =
                 auVar24._4_4_ * blower1.lower.field_0.m128[1] +
                 auVar21._4_4_ * blower0.lower.field_0.m128[1];
            auVar31._8_4_ =
                 auVar24._8_4_ * blower1.lower.field_0.m128[2] +
                 auVar21._8_4_ * blower0.lower.field_0.m128[2];
            auVar31._12_4_ =
                 auVar24._12_4_ * blower1.lower.field_0.m128[3] +
                 auVar21._12_4_ * blower0.lower.field_0.m128[3];
            auVar34._0_4_ =
                 auVar24._0_4_ * blower1.upper.field_0.m128[0] +
                 auVar21._0_4_ * blower0.upper.field_0.m128[0];
            auVar34._4_4_ =
                 auVar24._4_4_ * blower1.upper.field_0.m128[1] +
                 auVar21._4_4_ * blower0.upper.field_0.m128[1];
            auVar34._8_4_ =
                 auVar24._8_4_ * blower1.upper.field_0.m128[2] +
                 auVar21._8_4_ * blower0.upper.field_0.m128[2];
            auVar34._12_4_ =
                 auVar24._12_4_ * blower1.upper.field_0.m128[3] +
                 auVar21._12_4_ * blower0.upper.field_0.m128[3];
            auVar21 = vmaxss_avx(ZEXT416((uint)((float)local_1a8._0_4_ - fVar19)),ZEXT816(0) << 0x40
                                );
            auVar24 = vshufps_avx(auVar21,auVar21,0);
            auVar21 = ZEXT416((uint)(1.0 - auVar21._0_4_));
            auVar21 = vshufps_avx(auVar21,auVar21,0);
            auVar25._0_4_ =
                 auVar24._0_4_ * bupper0.lower.field_0.m128[0] +
                 auVar21._0_4_ * bupper1.lower.field_0.m128[0];
            auVar25._4_4_ =
                 auVar24._4_4_ * bupper0.lower.field_0.m128[1] +
                 auVar21._4_4_ * bupper1.lower.field_0.m128[1];
            auVar25._8_4_ =
                 auVar24._8_4_ * bupper0.lower.field_0.m128[2] +
                 auVar21._8_4_ * bupper1.lower.field_0.m128[2];
            auVar25._12_4_ =
                 auVar24._12_4_ * bupper0.lower.field_0.m128[3] +
                 auVar21._12_4_ * bupper1.lower.field_0.m128[3];
            auVar28._0_4_ =
                 auVar24._0_4_ * bupper0.upper.field_0.m128[0] +
                 auVar21._0_4_ * bupper1.upper.field_0.m128[0];
            auVar28._4_4_ =
                 auVar24._4_4_ * bupper0.upper.field_0.m128[1] +
                 auVar21._4_4_ * bupper1.upper.field_0.m128[1];
            auVar28._8_4_ =
                 auVar24._8_4_ * bupper0.upper.field_0.m128[2] +
                 auVar21._8_4_ * bupper1.upper.field_0.m128[2];
            auVar28._12_4_ =
                 auVar24._12_4_ * bupper0.upper.field_0.m128[3] +
                 auVar21._12_4_ * bupper1.upper.field_0.m128[3];
            if ((int)local_188 < 0) {
              local_188 = -NAN;
            }
            fVar7 = local_178 - fVar27;
            itime = (size_t)(int)local_188;
            while (itime = itime + 1, (long)itime < (long)iVar8) {
              auVar22._0_4_ = ((float)(int)itime / fVar2 - fVar27) / fVar7;
              auVar22._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar21 = vshufps_avx(auVar22,auVar22,0);
              local_1c8 = auVar25._0_4_;
              fStack_1c4 = auVar25._4_4_;
              fStack_1c0 = auVar25._8_4_;
              fStack_1bc = auVar25._12_4_;
              auVar24 = vshufps_avx(ZEXT416((uint)(1.0 - auVar22._0_4_)),
                                    ZEXT416((uint)(1.0 - auVar22._0_4_)),0);
              local_178 = auVar21._0_4_ * local_1c8 + auVar31._0_4_ * auVar24._0_4_;
              fStack_174 = auVar21._4_4_ * fStack_1c4 + auVar31._4_4_ * auVar24._4_4_;
              fStack_170 = auVar21._8_4_ * fStack_1c0 + auVar31._8_4_ * auVar24._8_4_;
              fStack_16c = auVar21._12_4_ * fStack_1bc + auVar31._12_4_ * auVar24._12_4_;
              fVar19 = auVar34._4_4_;
              fVar35 = auVar34._8_4_;
              fVar36 = auVar34._12_4_;
              local_188 = auVar28._0_4_ * auVar21._0_4_ + auVar34._0_4_ * auVar24._0_4_;
              fStack_184 = auVar28._4_4_ * auVar21._4_4_ + fVar19 * auVar24._4_4_;
              fStack_180 = auVar28._8_4_ * auVar21._8_4_ + fVar35 * auVar24._8_4_;
              fStack_17c = auVar28._12_4_ * auVar21._12_4_ + fVar36 * auVar24._12_4_;
              _local_1a8 = auVar31;
              _local_168 = auVar28;
              Points::linearBounds::anon_class_16_2_4e716a3c::operator()(&bi,&local_198,itime);
              auVar10._4_4_ = fStack_174;
              auVar10._0_4_ = local_178;
              auVar10._8_4_ = fStack_170;
              auVar10._12_4_ = fStack_16c;
              auVar21 = vsubps_avx((undefined1  [16])bi.lower.field_0,auVar10);
              auVar9._4_4_ = fStack_184;
              auVar9._0_4_ = local_188;
              auVar9._8_4_ = fStack_180;
              auVar9._12_4_ = fStack_17c;
              auVar20 = vsubps_avx((undefined1  [16])bi.upper.field_0,auVar9);
              auVar24 = vminps_avx(auVar21,ZEXT816(0) << 0x40);
              auVar21 = vmaxps_avx(auVar20,ZEXT816(0) << 0x40);
              auVar31._0_4_ = (float)local_1a8._0_4_ + auVar24._0_4_;
              auVar31._4_4_ = (float)local_1a8._4_4_ + auVar24._4_4_;
              auVar31._8_4_ = fStack_1a0 + auVar24._8_4_;
              auVar31._12_4_ = fStack_19c + auVar24._12_4_;
              auVar25._0_4_ = local_1c8 + auVar24._0_4_;
              auVar25._4_4_ = fStack_1c4 + auVar24._4_4_;
              auVar25._8_4_ = fStack_1c0 + auVar24._8_4_;
              auVar25._12_4_ = fStack_1bc + auVar24._12_4_;
              auVar34._0_4_ = auVar34._0_4_ + auVar21._0_4_;
              auVar34._4_4_ = fVar19 + auVar21._4_4_;
              auVar34._8_4_ = fVar35 + auVar21._8_4_;
              auVar34._12_4_ = fVar36 + auVar21._12_4_;
              auVar28._0_4_ = (float)local_168._0_4_ + auVar21._0_4_;
              auVar28._4_4_ = (float)local_168._4_4_ + auVar21._4_4_;
              auVar28._8_4_ = fStack_160 + auVar21._8_4_;
              auVar28._12_4_ = fStack_15c + auVar21._12_4_;
            }
          }
          auVar37 = ZEXT1664(ZEXT816(0) << 0x40);
          auVar21 = vmaxps_avx(auVar34,auVar28);
          auVar24 = vminps_avx(auVar31,auVar25);
          aVar5 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                  vinsertps_avx(auVar24,ZEXT416(geomID),0x30);
          aVar6 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                  vinsertps_avx(auVar21,ZEXT416((uint)uVar18),0x30);
          auVar21 = vminps_avx((undefined1  [16])auVar41._0_16_,(undefined1  [16])aVar5);
          auVar41 = ZEXT1664(auVar21);
          auVar21 = vmaxps_avx((undefined1  [16])auVar40._0_16_,(undefined1  [16])aVar6);
          auVar40 = ZEXT1664(auVar21);
          auVar26._0_4_ = aVar5.x + aVar6.x;
          auVar26._4_4_ = aVar5.y + aVar6.y;
          auVar26._8_4_ = aVar5.z + aVar6.z;
          auVar26._12_4_ = aVar5.field_3.w + aVar6.field_3.w;
          auVar21 = vminps_avx((undefined1  [16])auVar29._0_16_,auVar26);
          auVar29 = ZEXT1664(auVar21);
          auVar21 = vmaxps_avx((undefined1  [16])auVar30._0_16_,auVar26);
          auVar30 = ZEXT1664(auVar21);
          local_150 = local_150 + 1;
          k = local_148 + 1;
          local_140[local_148].lower.field_0.field_1 = aVar5;
          local_140[local_148].upper.field_0.field_1 = aVar6;
          auVar32 = ZEXT1664(auVar32._0_16_);
          auVar33 = ZEXT1664(auVar33._0_16_);
          auVar38 = ZEXT1664(CONCAT412(0xddccb9a2,CONCAT48(0xddccb9a2,0xddccb9a2ddccb9a2)));
          auVar39 = ZEXT1664(CONCAT412(0x5dccb9a2,CONCAT48(0x5dccb9a2,0x5dccb9a25dccb9a2)));
        }
        else {
          pRVar1 = (RawBufferView *)(psVar14 + -2);
          lVar16 = *psVar14 * (uVar18 & 0xffffffff);
          if (0.0 <= *(float *)(pRVar1->ptr_ofs + lVar16 + 0xc)) goto code_r0x00bf4f96;
        }
      }
LAB_00bf4fb9:
      uVar18 = uVar18 + 1;
    }
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0
         = auVar41._0_16_;
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0
         = auVar40._0_16_;
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0
         = auVar29._0_16_;
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0
         = auVar30._0_16_;
    __return_storage_ptr__->end = local_150;
  }
  return __return_storage_ptr__;
code_r0x00bf4f96:
  psVar14 = psVar14 + 7;
  auVar24 = *(undefined1 (*) [16])(pRVar1->ptr_ofs + lVar16);
  auVar23 = vcmpps_avx(auVar24,auVar38._0_16_,2);
  auVar24 = vcmpps_avx(auVar24,auVar39._0_16_,5);
  auVar24 = vorps_avx(auVar23,auVar24);
  uVar15 = vmovmskps_avx(auVar24);
  if ((char)uVar15 != '\0') goto LAB_00bf4fb9;
  goto LAB_00bf4f7a;
}

Assistant:

PrimInfo createPrimRefArrayMB(PrimRef* prims, const BBox1f& time_range, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        const BBox1f t0t1 = BBox1f::intersect(getTimeRange(), time_range);
        if (t0t1.empty()) return pinfo;
        
        for (size_t j = r.begin(); j < r.end(); j++) {
          LBBox3fa lbounds = empty;
          if (!linearBounds(j, t0t1, lbounds))
            continue;
          const PrimRef prim(lbounds.bounds(), geomID, unsigned(j));
          pinfo.add_center2(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }